

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsStatus.cpp
# Opt level: O0

string * highsStatusToString_abi_cxx11_(HighsStatus status)

{
  int in_ESI;
  string *in_RDI;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  if (in_ESI == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Error",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"OK",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Warning",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Unrecognised HiGHS status",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  return in_RDI;
}

Assistant:

std::string highsStatusToString(HighsStatus status) {
  switch (status) {
    case HighsStatus::kOk:
      return "OK";
    case HighsStatus::kWarning:
      return "Warning";
    case HighsStatus::kError:
      return "Error";
    default:
      assert(1 == 0);
      return "Unrecognised HiGHS status";
  }
}